

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerWriteBarrierManager.cpp
# Opt level: O1

void Memory::RecyclerWriteBarrierManager::WriteBarrier(void *address)

{
  bool bVar1;
  
  if ((Js::Configuration::Global[0x2c154] == '\x01') &&
     ((cardTable[(ulong)address >> 0xc] & 2) == 0)) {
    Js::Throw::FatalInternalError(-0x7fffbffb);
  }
  cardTable[(ulong)address >> 0xc] = cardTable[(ulong)address >> 0xc] | 1;
  bVar1 = Js::Phases::IsEnabled((Phases *)(Js::Configuration::Global + 0x23450),SWBPhase);
  if ((bVar1) && (Js::Configuration::Global[0x291a2] == '\x01')) {
    Output::Print(L"Writing to 0x%p (CIndex: %u)\n",address,(ulong)address >> 0xc);
    return;
  }
  return;
}

Assistant:

void
RecyclerWriteBarrierManager::WriteBarrier(void * address)
{
    if (IS_ASAN_FAKE_STACK_ADDR(address))
    {
        return;
    }

#ifdef RECYCLER_WRITE_BARRIER_BYTE
#if ENABLE_DEBUG_CONFIG_OPTIONS
    VerifyIsBarrierAddress(address);
#endif
    const uintptr_t index = GetCardTableIndex(address);
    cardTable[index] |= DIRTYBIT;
#else
    uint bitShift = (((uint)address) >> s_BitArrayCardTableShift);
    uint bitMask = 1 << bitShift;
    const uint cardIndex = ((uint) address) / (s_BytesPerCard);
    cardTable[cardIndex] |= bitMask;
#endif
#if DBG_DUMP
    // Global to process, use global configuration here
    if (PHASE_VERBOSE_TRACE1(Js::SWBPhase))
    {
        Output::Print(_u("Writing to 0x%p (CIndex: %u)\n"), address, index);
    }
#endif
}